

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.cpp
# Opt level: O1

bool Security::DontEncode(Opnd *opnd)

{
  byte bVar1;
  int iVar2;
  code *pcVar3;
  long lVar4;
  OpndKind OVar5;
  bool bVar6;
  undefined4 *puVar7;
  long lVar8;
  undefined1 uVar9;
  
  OVar5 = IR::Opnd::GetKind(opnd);
  switch(OVar5) {
  case OpndKindIntConst:
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar6) goto LAB_0062c131;
      *puVar7 = 0;
    }
    uVar9 = *(undefined1 *)&opnd[2].m_valueType.field_0;
    break;
  case OpndKindInt64Const:
    uVar9 = 0;
    break;
  case OpndKindAddr:
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar6) goto LAB_0062c131;
      *puVar7 = 0;
    }
    uVar9 = 1;
    if ((((ushort)opnd[2].m_valueType.field_0 & 1) == 0) &&
       ((bVar1 = *(byte *)((long)&opnd[2].m_valueType.field_0.bits + 1), bVar1 == 10 || (bVar1 == 1)
        ))) {
      uVar9 = *(short *)((long)&opnd[2]._vptr_Opnd + 6) == 0;
    }
    break;
  case OpndKindIndir:
    OVar5 = IR::Opnd::GetKind(opnd);
    if (OVar5 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar6) goto LAB_0062c131;
      *puVar7 = 0;
    }
    uVar9 = 1;
    if (opnd->field_0xe == '\0') {
      uVar9 = *(int *)&opnd[2]._vptr_Opnd == 0;
    }
    break;
  default:
    if (OVar5 == OpndKindList) {
      OVar5 = IR::Opnd::GetKind(opnd);
      if (OVar5 != OpndKindList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
        if (!bVar6) goto LAB_0062c131;
        *puVar7 = 0;
      }
      if (*(int *)&opnd[1]._vptr_Opnd < 1) {
        return true;
      }
      bVar6 = DontEncode((Opnd *)**(undefined8 **)&opnd[1].m_valueType);
      if (bVar6) {
        lVar4 = 1;
        do {
          lVar8 = lVar4;
          iVar2 = *(int *)&opnd[1]._vptr_Opnd;
          if (iVar2 <= lVar8) {
            return true;
          }
          bVar6 = DontEncode(*(Opnd **)(*(long *)&opnd[1].m_valueType + lVar8 * 8));
          lVar4 = lVar8 + 1;
        } while (bVar6);
        if (iVar2 <= lVar8) {
          return true;
        }
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Security.cpp"
                         ,0x136,
                         "(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }))"
                         ,
                         "opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); })"
                        );
      if (bVar6) {
        *puVar7 = 0;
        return true;
      }
LAB_0062c131:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  case OpndKindFloatConst:
  case OpndKindFloat32Const:
  case OpndKindSimd128Const:
  case OpndKindHelperCall:
  case OpndKindSym:
  case OpndKindReg:
    uVar9 = 1;
  }
  return (bool)uVar9;
}

Assistant:

bool
Security::DontEncode(IR::Opnd *opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindIntConst:
    {
        IR::IntConstOpnd *intConstOpnd = opnd->AsIntConstOpnd();
        return intConstOpnd->m_dontEncode;
    }

    case IR::OpndKindAddr:
    {
        IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
        return (addrOpnd->m_dontEncode ||
            !addrOpnd->IsVar() ||
            addrOpnd->m_address == nullptr ||
            !Js::TaggedNumber::Is(addrOpnd->m_address));
    }
    case IR::OpndKindIndir:
    {
        IR::IndirOpnd *indirOpnd = opnd->AsIndirOpnd();
        return indirOpnd->m_dontEncode || indirOpnd->GetOffset() == 0;
    }
    case IR::OpndKindInt64Const:
        return false;
    case IR::OpndKindList:
    {
        // We should only have RegOpnd in the ListOpnd therefore, we don't need to encode anything
        Assert(opnd->AsListOpnd()->All([](IR::ListOpndType* opnd) { return DontEncode(opnd); }));
        return true;
    }
    default:
        return true;
    }
}